

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGenericHandler.cxx
# Opt level: O3

bool __thiscall
cmCTestGenericHandler::StartLogFile
          (cmCTestGenericHandler *this,char *name,cmGeneratedFileStream *xofs)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmCTest *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  size_t sVar6;
  ostream *poVar7;
  ostringstream cmCTestLog_msg_1;
  ostringstream ostr;
  string local_340;
  undefined1 local_320 [112];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [376];
  
  if (name == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Cannot create log file without providing the name",0x31);
    std::ios::widen((char)(ostringstream *)local_1a8 +
                    (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    pcVar3 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestGenericHandler.cxx"
                 ,0x74,(char *)local_320._0_8_,false);
    if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    bVar5 = false;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Last",4);
    sVar6 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,name,sVar6);
    if (0 < this->SubmitIndex) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
      std::ostream::operator<<(local_1a8,this->SubmitIndex);
    }
    cmCTest::GetCurrentTag_abi_cxx11_((string *)local_320,this->CTest);
    uVar4 = local_320._8_8_;
    pcVar1 = local_320 + 0x10;
    if ((char *)local_320._0_8_ != pcVar1) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    if (uVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
      cmCTest::GetCurrentTag_abi_cxx11_((string *)local_320,this->CTest);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_320._0_8_,local_320._8_8_);
      if ((char *)local_320._0_8_ != pcVar1) {
        operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".log",4);
    pcVar3 = this->CTest;
    local_320._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"Temporary","");
    std::__cxx11::stringbuf::str();
    bVar5 = cmCTest::OpenOutputFile(pcVar3,(string *)local_320,&local_340,xofs,false);
    paVar2 = &local_340.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != paVar2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    if ((char *)local_320._0_8_ != pcVar1) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    if (!bVar5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"Cannot create log file: ",0x18);
      std::__cxx11::stringbuf::str();
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_320,local_340._M_dataplus._M_p,local_340._M_string_length
                         );
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != paVar2) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      pcVar3 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestGenericHandler.cxx"
                   ,0x82,local_340._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != paVar2) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
      std::ios_base::~ios_base(local_2b0);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  return bVar5;
}

Assistant:

bool cmCTestGenericHandler::StartLogFile(const char* name,
                                         cmGeneratedFileStream& xofs)
{
  if (!name) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create log file without providing the name"
                 << std::endl;);
    return false;
  }
  std::ostringstream ostr;
  ostr << "Last" << name;
  if (this->SubmitIndex > 0) {
    ostr << "_" << this->SubmitIndex;
  }
  if (!this->CTest->GetCurrentTag().empty()) {
    ostr << "_" << this->CTest->GetCurrentTag();
  }
  ostr << ".log";
  if (!this->CTest->OpenOutputFile("Temporary", ostr.str(), xofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create log file: " << ostr.str() << std::endl);
    return false;
  }
  return true;
}